

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  String *pSVar1;
  bool bVar2;
  ArrayIndex AVar3;
  size_t sVar4;
  Value *pVVar5;
  int iVar6;
  LargestUInt value_00;
  LargestInt value_01;
  char *pcVar7;
  char cVar8;
  PrecisionType in_R8D;
  ArrayIndex index;
  String *key;
  Json *pJVar9;
  double value_02;
  Members members;
  String local_68;
  Members local_48;
  
  cVar8 = (char)*(ushort *)&value->bits_;
  iVar6 = 0x13c3b4;
  switch(cVar8) {
  case '\0':
    if (this->dropNullPlaceholders_ != false) {
      return;
    }
    std::__cxx11::string::append((char *)&this->document_);
    return;
  case '\x01':
    pJVar9 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar9,value_01);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case '\x02':
    pJVar9 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar9,value_00);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case '\x03':
    value_02 = Value::asDouble(value);
    (anonymous_namespace)::valueToString_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)0x0,value_02,true,0,in_R8D);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case '\x04':
    pJVar9 = (Json *)(value->value_).string_;
    bVar2 = pJVar9 == (Json *)0x0;
    if (!bVar2 && cVar8 == '\x04') {
      if ((*(ushort *)&value->bits_ >> 8 & 1) == 0) {
        sVar4 = strlen((char *)pJVar9);
        iVar6 = (int)sVar4;
      }
      else {
        iVar6 = *(int *)pJVar9;
        pJVar9 = pJVar9 + 4;
      }
      iVar6 = iVar6 + (int)pJVar9;
    }
    if (bVar2 || cVar8 != '\x04') {
      return;
    }
    valueToQuotedStringN_abi_cxx11_
              (&local_68,pJVar9,(char *)(ulong)(uint)(iVar6 - (int)pJVar9),0,SUB41(in_R8D,0));
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case '\x05':
    bVar2 = Value::asBool(value);
    pcVar7 = "false";
    if (bVar2) {
      pcVar7 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar7,pcVar7 + ((ulong)bVar2 ^ 5));
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_00113675;
  case '\x06':
    cVar8 = (char)this + '\b';
    std::__cxx11::string::push_back(cVar8);
    AVar3 = Value::size(value);
    if (AVar3 != 0) {
      index = 0;
      do {
        if (index != 0) {
          std::__cxx11::string::push_back(cVar8);
        }
        pVVar5 = Value::operator[](value,index);
        writeValue(this,pVVar5);
        index = index + 1;
      } while (AVar3 != index);
    }
    std::__cxx11::string::push_back(cVar8);
    return;
  case '\a':
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    pSVar1 = &this->document_;
    cVar8 = (char)pSVar1;
    std::__cxx11::string::push_back(cVar8);
    key = local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (key != local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::push_back(cVar8);
        }
        valueToQuotedStringN_abi_cxx11_
                  (&local_68,(Json *)(key->_M_dataplus)._M_p,
                   (char *)(ulong)(uint)key->_M_string_length,0,SUB41(in_R8D,0));
        std::__cxx11::string::_M_append((char *)pSVar1,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)pSVar1);
        pVVar5 = Value::operator[](value,key);
        writeValue(this,pVVar5);
        key = key + 1;
      } while (key != local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::push_back(cVar8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  default:
    goto switchD_0011338f_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_00113675:
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
switchD_0011338f_default:
  return;
}

Assistant:

void FastWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    if (!dropNullPlaceholders_)
      document_ += "null";
    break;
  case intValue:
    document_ += valueToString(value.asLargestInt());
    break;
  case uintValue:
    document_ += valueToString(value.asLargestUInt());
    break;
  case realValue:
    document_ += valueToString(value.asDouble());
    break;
  case stringValue: {
    // Is NULL possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok)
      document_ += valueToQuotedStringN(str, static_cast<unsigned>(end - str));
    break;
  }
  case booleanValue:
    document_ += valueToString(value.asBool());
    break;
  case arrayValue: {
    document_ += '[';
    ArrayIndex size = value.size();
    for (ArrayIndex index = 0; index < size; ++index) {
      if (index > 0)
        document_ += ',';
      writeValue(value[index]);
    }
    document_ += ']';
  } break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    document_ += '{';
    for (auto it = members.begin(); it != members.end(); ++it) {
      const String& name = *it;
      if (it != members.begin())
        document_ += ',';
      document_ += valueToQuotedStringN(name.data(),
                                        static_cast<unsigned>(name.length()));
      document_ += yamlCompatibilityEnabled_ ? ": " : ":";
      writeValue(value[name]);
    }
    document_ += '}';
  } break;
  }
}